

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArithmetic.cpp
# Opt level: O0

void testArithmetic(void)

{
  half hVar1;
  ostream *poVar2;
  void *pvVar3;
  float fVar4;
  float fVar5;
  half h2;
  half h1;
  float f2;
  float f1;
  undefined4 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe2;
  undefined2 in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe6;
  half hVar6;
  half hVar7;
  half local_c;
  half in_stack_fffffffffffffff6;
  
  std::operator<<((ostream *)&std::cout,"basic arithmetic operations:\n");
  Imath_3_2::half::half
            ((half *)CONCAT26(in_stack_ffffffffffffffe6,
                              CONCAT24(in_stack_ffffffffffffffe4,
                                       CONCAT22(in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0)
                                      )),in_stack_ffffffffffffffdc);
  Imath_3_2::half::half
            ((half *)CONCAT26(in_stack_ffffffffffffffe6,
                              CONCAT24(in_stack_ffffffffffffffe4,
                                       CONCAT22(in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0)
                                      )),in_stack_ffffffffffffffdc);
  poVar2 = std::operator<<((ostream *)&std::cout,"f1 = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1.0);
  poVar2 = std::operator<<(poVar2,", f2 = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,2.0);
  poVar2 = std::operator<<(poVar2,", h1 = ");
  poVar2 = (ostream *)operator<<(poVar2,in_stack_fffffffffffffff6);
  poVar2 = std::operator<<(poVar2,", h2 = ");
  pvVar3 = (void *)operator<<(poVar2,local_c);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  Imath_3_2::half::operator=
            ((half *)CONCAT26(in_stack_ffffffffffffffe6,
                              CONCAT24(in_stack_ffffffffffffffe4,
                                       CONCAT22(in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0)
                                      )),in_stack_ffffffffffffffdc);
  fVar4 = Imath_3_2::half::operator_cast_to_float
                    ((half *)CONCAT26(in_stack_ffffffffffffffe6,
                                      CONCAT24(in_stack_ffffffffffffffe4,
                                               CONCAT22(in_stack_ffffffffffffffe2,
                                                        in_stack_ffffffffffffffe0))));
  if ((fVar4 != 3.0) || (NAN(fVar4))) {
    __assert_fail("h1 == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testArithmetic.cpp"
                  ,0x27,"void testArithmetic()");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"h1 = f1 + f2: ");
  hVar6._h = in_stack_fffffffffffffff6._h;
  pvVar3 = (void *)operator<<(poVar2,in_stack_fffffffffffffff6);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  Imath_3_2::half::operator+=
            ((half *)CONCAT26(in_stack_ffffffffffffffe6,
                              CONCAT24(in_stack_ffffffffffffffe4,
                                       CONCAT22(in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0)
                                      )),in_stack_ffffffffffffffdc);
  fVar4 = Imath_3_2::half::operator_cast_to_float
                    ((half *)CONCAT26(in_stack_ffffffffffffffe6,
                                      CONCAT24(in_stack_ffffffffffffffe4,
                                               CONCAT22(in_stack_ffffffffffffffe2,
                                                        in_stack_ffffffffffffffe0))));
  if ((fVar4 != 5.0) || (NAN(fVar4))) {
    __assert_fail("h2 == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testArithmetic.cpp"
                  ,0x2c,"void testArithmetic()");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"h2 += f1: ");
  hVar1._h = local_c._h;
  pvVar3 = (void *)operator<<(poVar2,local_c);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  fVar4 = Imath_3_2::half::operator_cast_to_float
                    ((half *)CONCAT26(in_stack_ffffffffffffffe6,
                                      CONCAT24(in_stack_ffffffffffffffe4,
                                               CONCAT22(in_stack_ffffffffffffffe2,
                                                        in_stack_ffffffffffffffe0))));
  Imath_3_2::half::operator_cast_to_float
            ((half *)CONCAT26(in_stack_ffffffffffffffe6,
                              CONCAT24(in_stack_ffffffffffffffe4,
                                       CONCAT22(in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0)
                                      )));
  Imath_3_2::half::operator=
            ((half *)CONCAT26(in_stack_ffffffffffffffe6,
                              CONCAT24(in_stack_ffffffffffffffe4,
                                       CONCAT22(in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0)
                                      )),fVar4);
  fVar5 = Imath_3_2::half::operator_cast_to_float
                    ((half *)CONCAT26(in_stack_ffffffffffffffe6,
                                      CONCAT24(in_stack_ffffffffffffffe4,
                                               CONCAT22(in_stack_ffffffffffffffe2,
                                                        in_stack_ffffffffffffffe0))));
  if ((fVar5 != 8.0) || (NAN(fVar5))) {
    __assert_fail("h2 == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testArithmetic.cpp"
                  ,0x31,"void testArithmetic()");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"h2 = h1 + h2: ");
  hVar7._h = local_c._h;
  pvVar3 = (void *)operator<<(poVar2,local_c);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  Imath_3_2::half::operator+=
            ((half *)CONCAT26(in_stack_fffffffffffffff6._h,
                              CONCAT24(hVar1._h,CONCAT22(hVar7._h,hVar6._h))),hVar6);
  fVar5 = Imath_3_2::half::operator_cast_to_float
                    ((half *)CONCAT26(in_stack_ffffffffffffffe6,
                                      CONCAT24(in_stack_ffffffffffffffe4,
                                               CONCAT22(in_stack_ffffffffffffffe2,
                                                        in_stack_ffffffffffffffe0))));
  if ((fVar5 == 11.0) && (!NAN(fVar5))) {
    poVar2 = std::operator<<((ostream *)&std::cout,"h2 += h1: ");
    hVar6._h = local_c._h;
    pvVar3 = (void *)operator<<(poVar2,local_c);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    fVar5 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT26(hVar6._h,CONCAT24(in_stack_ffffffffffffffe4,
                                                          CONCAT22(in_stack_ffffffffffffffe2,
                                                                   in_stack_ffffffffffffffe0))));
    if ((fVar5 != 11.0) || (NAN(fVar5))) {
      __assert_fail("h1 == 11",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testArithmetic.cpp"
                    ,0x3b,"void testArithmetic()");
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"h1 = h2: ");
    pvVar3 = (void *)operator<<(poVar2,local_c);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    hVar1 = Imath_3_2::half::operator-((half *)CONCAT44(fVar4,in_stack_ffffffffffffffd8));
    fVar4 = Imath_3_2::half::operator_cast_to_float
                      ((half *)CONCAT26(hVar6._h,CONCAT24(local_c._h,
                                                          CONCAT22(hVar1._h,
                                                  in_stack_ffffffffffffffe0))));
    if ((fVar4 == -11.0) && (!NAN(fVar4))) {
      poVar2 = std::operator<<((ostream *)&std::cout,"h2 = -h1: ");
      pvVar3 = (void *)operator<<(poVar2,hVar1);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"ok\n\n");
      std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
      return;
    }
    __assert_fail("h2 == -11",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testArithmetic.cpp"
                  ,0x40,"void testArithmetic()");
  }
  __assert_fail("h2 == 11",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testArithmetic.cpp"
                ,0x36,"void testArithmetic()");
}

Assistant:

void
testArithmetic ()
{
    cout << "basic arithmetic operations:\n";

    float f1 (1);
    float f2 (2);
    half  h1 (3);
    half  h2 (4);

    cout << "f1 = " << f1
         << ", "
            "f2 = "
         << f2
         << ", "
            "h1 = "
         << h1
         << ", "
            "h2 = "
         << h2 << endl;

    h1 = f1 + f2;
    assert (h1 == 3);

    cout << "h1 = f1 + f2: " << h1 << endl;

    h2 += f1;
    assert (h2 == 5);

    cout << "h2 += f1: " << h2 << endl;

    h2 = h1 + h2;
    assert (h2 == 8);

    cout << "h2 = h1 + h2: " << h2 << endl;

    h2 += h1;
    assert (h2 == 11);

    cout << "h2 += h1: " << h2 << endl;

    h1 = h2;
    assert (h1 == 11);

    cout << "h1 = h2: " << h1 << endl;

    h2 = -h1;
    assert (h2 == -11);

    cout << "h2 = -h1: " << h2 << endl;

    cout << "ok\n\n" << flush;
}